

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O1

ObjectPair __thiscall arangodb::velocypack::ObjectIterator::operator*(ObjectIterator *this)

{
  byte bVar1;
  byte *pbVar2;
  Slice SVar3;
  ulong uVar4;
  ObjectPair OVar5;
  Slice key;
  byte *local_20;
  
  local_20 = this->_current;
  if (local_20 == (byte *)0x0) {
    local_20 = (byte *)SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                       getNthKeyUntranslated
                                 ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)this,this->_position);
    SVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_20);
    bVar1 = "\x01\x01"[*local_20];
    pbVar2 = local_20;
  }
  else {
    SVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_20);
    pbVar2 = this->_current;
    bVar1 = "\x01\x01"[*local_20];
  }
  uVar4 = (ulong)bVar1;
  if (uVar4 == 0) {
    uVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_20,local_20);
  }
  OVar5.value._start = pbVar2 + uVar4;
  OVar5.key._start = SVar3._start;
  return OVar5;
}

Assistant:

[[nodiscard]] ObjectPair operator*() const {
    if (_current != nullptr) {
      Slice key{_current};
      return {key.makeKey(), Slice(_current + key.byteSize())};
    }
    // intentionally no out-of-bounds checking here,
    // as it will be performed by Slice::getNthOffset()
    Slice key{_slice.getNthKeyUntranslated(_position)};
    return {key.makeKey(), Slice(key.begin() + key.byteSize())};
  }